

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

OrthographicCamera *
pbrt::OrthographicCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,FilmHandle *film,
          MediumHandle *medium,FileLoc *loc,Allocator alloc)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  OrthographicCamera *pOVar5;
  undefined1 auVar6 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Float focaldistance;
  Float lensradius;
  vector<float,_std::allocator<float>_> sw;
  CameraBaseParameters cameraBaseParameters;
  allocator<char> local_3e1;
  Bounds2<float> local_3e0;
  string local_3d0;
  Float local_3b0;
  Float local_3ac;
  Float local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  _Vector_base<float,_std::allocator<float>_> local_390;
  polymorphic_allocator<std::byte> local_378;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_370;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_368;
  CameraBaseParameters local_360;
  
  local_368.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  local_370.bits =
       (medium->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_378.memoryResource = alloc.memoryResource;
  CameraBaseParameters::CameraBaseParameters
            (&local_360,cameraTransform,(FilmHandle *)&local_368,(MediumHandle *)&local_370,
             parameters,loc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"lensradius",(allocator<char> *)&local_390);
  local_3a8 = ParameterDictionary::GetOneFloat(parameters,&local_3d0,0.0);
  std::__cxx11::string::~string((string *)&local_3d0);
  local_3ac = local_3a8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"focaldistance",(allocator<char> *)&local_390);
  local_3a8 = ParameterDictionary::GetOneFloat(parameters,&local_3d0,1e+06);
  std::__cxx11::string::~string((string *)&local_3d0);
  local_3b0 = local_3a8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"frameaspectratio",(allocator<char> *)&local_390);
  uVar1 = *(undefined8 *)
           ((film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits & 0xffffffffffff);
  local_3a8 = ParameterDictionary::GetOneFloat
                        (parameters,&local_3d0,
                         (float)(int)uVar1 / (float)(int)((ulong)uVar1 >> 0x20));
  uStack_3a4 = extraout_XMM0_Db;
  uStack_3a0 = extraout_XMM0_Dc;
  uStack_39c = extraout_XMM0_Dd;
  std::__cxx11::string::~string((string *)&local_3d0);
  auVar4._4_4_ = uStack_3a4;
  auVar4._0_4_ = local_3a8;
  auVar4._8_4_ = uStack_3a0;
  auVar4._12_4_ = uStack_39c;
  auVar7._8_8_ = 0x3f800000bf800000;
  auVar7._0_8_ = 0x3f800000bf800000;
  auVar8._4_4_ = local_3a8;
  auVar8._0_4_ = local_3a8;
  auVar8._8_4_ = local_3a8;
  auVar8._12_4_ = local_3a8;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(auVar8,auVar2);
  uVar1 = vcmpss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar4,1);
  bVar3 = (bool)((byte)uVar1 & 1);
  auVar2 = vmaxss_avx(auVar4,SUB6416(ZEXT464(0x3f800000),0));
  local_3e0.pMin.super_Tuple2<pbrt::Point2,_float>.x =
       (float)((uint)bVar3 * auVar6._0_4_ + (uint)!bVar3 * -0x40800000);
  if (local_3a8 <= 1.0) {
    auVar7 = vdivps_avx(auVar7,auVar8);
  }
  local_3e0.pMax.super_Tuple2<pbrt::Point2,_float>.x = auVar2._0_4_;
  local_3e0.pMin.super_Tuple2<pbrt::Point2,_float>.y = auVar7._0_4_;
  local_3e0.pMax.super_Tuple2<pbrt::Point2,_float>.y = (float)vextractps_avx(auVar7,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"screenwindow",&local_3e1)
  ;
  ParameterDictionary::GetFloatArray
            ((vector<float,_std::allocator<float>_> *)&local_390,parameters,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  if (local_390._M_impl.super__Vector_impl_data._M_start !=
      local_390._M_impl.super__Vector_impl_data._M_finish) {
    if ((long)local_390._M_impl.super__Vector_impl_data._M_finish -
        (long)local_390._M_impl.super__Vector_impl_data._M_start == 0x10) {
      local_3e0.pMin.super_Tuple2<pbrt::Point2,_float>.x =
           *local_390._M_impl.super__Vector_impl_data._M_start;
      local_3e0.pMax.super_Tuple2<pbrt::Point2,_float>.x =
           local_390._M_impl.super__Vector_impl_data._M_start[1];
      local_3e0.pMin.super_Tuple2<pbrt::Point2,_float>.y =
           local_390._M_impl.super__Vector_impl_data._M_start[2];
      local_3e0.pMax.super_Tuple2<pbrt::Point2,_float>.y =
           local_390._M_impl.super__Vector_impl_data._M_start[3];
    }
    else {
      Error<>("\"screenwindow\" should have four values");
    }
  }
  pOVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::OrthographicCamera,pbrt::CameraBaseParameters&,pbrt::Bounds2<float>&,float&,float&>
                     (&local_378,&local_360,&local_3e0,&local_3ac,&local_3b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_390);
  return pOVar5;
}

Assistant:

OrthographicCamera *OrthographicCamera::Create(const ParameterDictionary &parameters,
                                               const CameraTransform &cameraTransform,
                                               FilmHandle film, MediumHandle medium,
                                               const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    Float lensradius = parameters.GetOneFloat("lensradius", 0.f);
    Float focaldistance = parameters.GetOneFloat("focaldistance", 1e6f);
    Float frame =
        parameters.GetOneFloat("frameaspectratio", Float(film.FullResolution().x) /
                                                       Float(film.FullResolution().y));
    Bounds2f screen;
    if (frame > 1.f) {
        screen.pMin.x = -frame;
        screen.pMax.x = frame;
        screen.pMin.y = -1.f;
        screen.pMax.y = 1.f;
    } else {
        screen.pMin.x = -1.f;
        screen.pMax.x = 1.f;
        screen.pMin.y = -1.f / frame;
        screen.pMax.y = 1.f / frame;
    }
    std::vector<Float> sw = parameters.GetFloatArray("screenwindow");
    if (!sw.empty()) {
        if (sw.size() == 4) {
            screen.pMin.x = sw[0];
            screen.pMax.x = sw[1];
            screen.pMin.y = sw[2];
            screen.pMax.y = sw[3];
        } else
            Error("\"screenwindow\" should have four values");
    }
    return alloc.new_object<OrthographicCamera>(cameraBaseParameters, screen, lensradius,
                                                focaldistance);
}